

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void ReadArray<aiColor4t<float>>(IOStream *stream,aiColor4t<float> *out,uint size)

{
  aiColor4t<float> *paVar1;
  aiColor4D aVar2;
  undefined8 local_30;
  undefined8 local_28;
  uint local_20;
  uint i;
  uint size_local;
  aiColor4t<float> *out_local;
  IOStream *stream_local;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiColor4t<float>]");
  }
  if (out != (aiColor4t<float> *)0x0) {
    for (local_20 = 0; local_20 < size; local_20 = local_20 + 1) {
      aVar2 = Read<aiColor4t<float>>(stream);
      paVar1 = out + local_20;
      local_30 = aVar2._0_8_;
      paVar1->r = (float)(undefined4)local_30;
      paVar1->g = (float)local_30._4_4_;
      local_28 = aVar2._8_8_;
      paVar1->b = (float)(undefined4)local_28;
      paVar1->a = (float)local_28._4_4_;
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiColor4t<float>]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}